

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O3

u16 __thiscall SymbolTable::findLongestSymbol(SymbolTable *this,Symbol s)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  anon_union_8_2_43acef4c_for_val aVar4;
  ulong uVar5;
  
  aVar4 = s.val;
  uVar3 = (s.val._0_4_ & 0xffffff) * -0x4ee6db1f;
  uVar5 = (ulong)(((uVar3 >> 0xf ^ uVar3) & 0x3ff) << 4);
  uVar1 = *(ulong *)((long)&this->hashTab[0].icl + uVar5);
  if ((s.icl < uVar1) ||
     (*(ulong *)((long)&this->hashTab[0].val + uVar5) !=
      (aVar4.num << ((byte)uVar1 & 0x3f)) >> ((byte)uVar1 & 0x3f))) {
    if ((((undefined1  [16])s & (undefined1  [16])0xfffffffe0000000) != (undefined1  [16])0x0) &&
       (uVar2 = this->shortCodes[aVar4.num & 0xffff] & 0x1ff, 0xff < uVar2)) {
      return uVar2;
    }
    uVar2 = this->byteCodes[aVar4.num & 0xff];
  }
  else {
    uVar2 = (ushort)(uVar1 >> 0x10);
  }
  return uVar2 & 0x1ff;
}

Assistant:

size_t hash() const { size_t v = 0xFFFFFF & val.num; return FSST_HASH(v); }